

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

bool vkt::sr::isImageSizeSupported
               (VkImageType imageType,UVec3 *imageSize,VkPhysicalDeviceLimits *limits)

{
  uint uVar1;
  
  if (imageType == VK_IMAGE_TYPE_3D) {
    uVar1 = limits->maxImageDimension3D;
    if ((imageSize->m_data[0] <= uVar1) && (imageSize->m_data[1] <= uVar1)) {
      return imageSize->m_data[2] <= uVar1;
    }
  }
  else if (imageType == VK_IMAGE_TYPE_2D) {
    if ((imageSize->m_data[0] <= limits->maxImageDimension2D) &&
       (imageSize->m_data[1] <= limits->maxImageDimension2D)) goto LAB_0063434d;
  }
  else {
    if (imageType != VK_IMAGE_TYPE_1D) {
      return false;
    }
    if ((imageSize->m_data[0] <= limits->maxImageDimension1D) && (imageSize->m_data[1] == 1)) {
LAB_0063434d:
      return imageSize->m_data[2] == 1;
    }
  }
  return false;
}

Assistant:

bool isImageSizeSupported (const VkImageType imageType, const tcu::UVec3& imageSize, const vk::VkPhysicalDeviceLimits& limits)
{
	switch (imageType)
	{
		case VK_IMAGE_TYPE_1D:
			return (imageSize.x() <= limits.maxImageDimension1D
				 && imageSize.y() == 1
				 && imageSize.z() == 1);
		case VK_IMAGE_TYPE_2D:
			return (imageSize.x() <= limits.maxImageDimension2D
				 && imageSize.y() <= limits.maxImageDimension2D
				 && imageSize.z() == 1);
		case VK_IMAGE_TYPE_3D:
			return (imageSize.x() <= limits.maxImageDimension3D
				 && imageSize.y() <= limits.maxImageDimension3D
				 && imageSize.z() <= limits.maxImageDimension3D);
		default:
			DE_FATAL("Unknown image type");
			return false;
	}
}